

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O2

void __thiscall
CFFFileInput::SetupSIDToGlyphMapWithStandard
          (CFFFileInput *this,unsigned_short *inStandardCharSet,
          unsigned_short inStandardCharSetLength,UShortToCharStringMap *ioCharMap,
          CharStrings *inCharStrings)

{
  undefined6 in_register_00000012;
  ulong uVar1;
  long lVar2;
  pair<const_unsigned_short,_IndexElement_*> local_40;
  
  local_40.first = 0;
  local_40.second = inCharStrings->mCharStringsIndex;
  std::
  _Rb_tree<unsigned_short,std::pair<unsigned_short_const,IndexElement*>,std::_Select1st<std::pair<unsigned_short_const,IndexElement*>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,IndexElement*>>>
  ::_M_insert_unique<std::pair<unsigned_short_const,IndexElement*>>
            ((_Rb_tree<unsigned_short,std::pair<unsigned_short_const,IndexElement*>,std::_Select1st<std::pair<unsigned_short_const,IndexElement*>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,IndexElement*>>>
              *)ioCharMap,&local_40);
  lVar2 = 0x18;
  for (uVar1 = 1;
      (uVar1 < (CONCAT62(in_register_00000012,inStandardCharSetLength) & 0xffffffff) &&
      (uVar1 < inCharStrings->mCharStringsCount)); uVar1 = uVar1 + 1) {
    local_40.second =
         (IndexElement *)((long)&inCharStrings->mCharStringsIndex->mStartPosition + lVar2);
    local_40.first = inStandardCharSet[uVar1];
    std::
    _Rb_tree<unsigned_short,std::pair<unsigned_short_const,IndexElement*>,std::_Select1st<std::pair<unsigned_short_const,IndexElement*>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,IndexElement*>>>
    ::_M_insert_unique<std::pair<unsigned_short_const,IndexElement*>>
              ((_Rb_tree<unsigned_short,std::pair<unsigned_short_const,IndexElement*>,std::_Select1st<std::pair<unsigned_short_const,IndexElement*>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,IndexElement*>>>
                *)ioCharMap,&local_40);
    lVar2 = lVar2 + 0x18;
  }
  return;
}

Assistant:

void CFFFileInput::SetupSIDToGlyphMapWithStandard(	const unsigned short* inStandardCharSet,
													unsigned short inStandardCharSetLength,
													UShortToCharStringMap& ioCharMap,
													const CharStrings& inCharStrings)
{
	ioCharMap.insert(UShortToCharStringMap::value_type(0,inCharStrings.mCharStringsIndex));
	unsigned short i;
	for(i = 1; i < inCharStrings.mCharStringsCount && i < inStandardCharSetLength;++i)
	{
		ioCharMap.insert(UShortToCharStringMap::value_type(
				inStandardCharSet[i],inCharStrings.mCharStringsIndex + i));
	}
}